

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeduh.c
# Opt level: O1

DUH_SIGNAL * make_signal(DUH_SIGTYPE_DESC *desc,sigdata_t *sigdata)

{
  DUH_SIGNAL *pDVar1;
  
  pDVar1 = (DUH_SIGNAL *)malloc(0x10);
  if (pDVar1 == (DUH_SIGNAL *)0x0) {
    if (sigdata != (sigdata_t *)0x0 && desc->unload_sigdata != (DUH_UNLOAD_SIGDATA)0x0) {
      (*desc->unload_sigdata)(sigdata);
    }
    pDVar1 = (DUH_SIGNAL *)0x0;
  }
  else {
    pDVar1->desc = desc;
    pDVar1->sigdata = sigdata;
  }
  return pDVar1;
}

Assistant:

static DUH_SIGNAL *make_signal(DUH_SIGTYPE_DESC *desc, sigdata_t *sigdata)
{
	DUH_SIGNAL *signal;

	ASSERT((desc->start_sigrenderer && desc->end_sigrenderer) || (!desc->start_sigrenderer && !desc->end_sigrenderer));
	ASSERT(desc->sigrenderer_generate_samples && desc->sigrenderer_get_current_sample);

	signal = malloc(sizeof(*signal));

	if (!signal) {
		if (desc->unload_sigdata)
			if (sigdata)
				(*desc->unload_sigdata)(sigdata);
		return NULL;
	}

	signal->desc = desc;
	signal->sigdata = sigdata;

	return signal;
}